

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void PreVisitCatch(ParseNodeCatch *pnodeCatch,ByteCodeGenerator *byteCodeGenerator)

{
  Symbol *this;
  code *pcVar1;
  bool bVar2;
  ParseNodeParamPattern *pPVar3;
  ParseNodePtr pPVar4;
  ParseNodeName *this_00;
  Symbol **ppSVar5;
  Scope *pSVar6;
  undefined4 *puVar7;
  LPCOLESTR pOVar8;
  char16 *pcVar9;
  Symbol *sym;
  ParseNodeName *pnodeName;
  ParseNodeParamPattern *pnodeParamPattern;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeCatch *pnodeCatch_local;
  
  pnodeParamPattern = (ParseNodeParamPattern *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeCatch;
  ByteCodeGenerator::StartBindCatch(byteCodeGenerator,(ParseNode *)pnodeCatch);
  bVar2 = ParseNodeCatch::HasPatternParam((ParseNodeCatch *)byteCodeGenerator_local);
  if (bVar2) {
    pPVar4 = ParseNodeCatch::GetParam((ParseNodeCatch *)byteCodeGenerator_local);
    pPVar3 = ParseNode::AsParseNodeParamPattern(pPVar4);
    Parser::MapBindIdentifier<PreVisitCatch(ParseNodeCatch*,ByteCodeGenerator*)::__0>
              ((pPVar3->super_ParseNodeUni).pnode1,(anon_class_8_1_ae4198de)&pnodeParamPattern);
  }
  else {
    bVar2 = ParseNodeCatch::HasParam((ParseNodeCatch *)byteCodeGenerator_local);
    if (bVar2) {
      pPVar4 = ParseNodeCatch::GetParam((ParseNodeCatch *)byteCodeGenerator_local);
      this_00 = ParseNode::AsParseNodeName(pPVar4);
      ppSVar5 = ParseNodeName::GetSymRef(this_00);
      this = *ppSVar5;
      pSVar6 = Symbol::GetScope(this);
      if (pSVar6 != (Scope *)byteCodeGenerator_local->parentScopeInfo) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xe83,"(sym->GetScope() == pnodeCatch->scope)",
                           "sym->GetScope() == pnodeCatch->scope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar2 = ByteCodeGenerator::Trace((ByteCodeGenerator *)pnodeParamPattern);
      if (bVar2) {
        pOVar8 = Ident::Psz(this_00->pid);
        pcVar9 = Symbol::GetSymbolTypeName(this);
        Output::Print(L"current context has declared catch var %s of type %s\n",pOVar8,pcVar9);
      }
      Symbol::SetIsCatch(this,true);
      this_00->sym = this;
    }
  }
  AddFunctionsToScope((ParseNodePtr)byteCodeGenerator_local->globalScope,
                      (ByteCodeGenerator *)pnodeParamPattern);
  return;
}

Assistant:

void PreVisitCatch(ParseNodeCatch *pnodeCatch, ByteCodeGenerator *byteCodeGenerator)
{
    // Push the catch scope and add the catch expression to it.
    byteCodeGenerator->StartBindCatch(pnodeCatch);
    
    if (pnodeCatch->HasPatternParam())
    {
        ParseNodeParamPattern * pnodeParamPattern = pnodeCatch->GetParam()->AsParseNodeParamPattern();
        Parser::MapBindIdentifier(pnodeParamPattern->pnode1, [&](ParseNodePtr item)
        {
            Symbol *sym = item->AsParseNodeVar()->sym;
#if DBG_DUMP
            if (byteCodeGenerator->Trace())
            {
                Output::Print(_u("current context has declared catch var %s of type %s\n"),
                    item->AsParseNodeVar()->pid->Psz(), sym->GetSymbolTypeName());
            }
#endif
            sym->SetIsCatch(true);
            sym->SetIsBlockVar(true);
        });
    }
    else if (pnodeCatch->HasParam())
    {
        ParseNodeName * pnodeName = pnodeCatch->GetParam()->AsParseNodeName();
        Symbol *sym = *pnodeName->GetSymRef();
        Assert(sym->GetScope() == pnodeCatch->scope);
#if DBG_DUMP
        if (byteCodeGenerator->Trace())
        {
            Output::Print(_u("current context has declared catch var %s of type %s\n"),
                pnodeName->pid->Psz(), sym->GetSymbolTypeName());
        }
#endif
        sym->SetIsCatch(true);
        pnodeName->sym = sym;
    }
    
    // This call will actually add the nested function symbols to the enclosing function scope (which is what we want).
    AddFunctionsToScope(pnodeCatch->pnodeScopes, byteCodeGenerator);
}